

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O3

size_t __thiscall docopt::LeafPattern::hash(LeafPattern *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  hash<docopt::value> local_2a;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_29 [7];
  hash<docopt::value> hasher_1;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hasher;
  
  sVar1 = std::type_info::hash_code((type_info *)(this->super_Pattern)._vptr_Pattern[-1]);
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(local_29,&this->fName);
  uVar3 = sVar2 + 0x9e3779b9 + (sVar1 >> 2) + sVar1 * 0x40 ^ sVar1;
  sVar1 = std::hash<docopt::value>::operator()(&local_2a,&this->fValue);
  return sVar1 + uVar3 * 0x40 + (uVar3 >> 2) + 0x9e3779b9 ^ uVar3;
}

Assistant:

virtual size_t hash() const override {
			size_t seed = typeid(*this).hash_code();
			hash_combine(seed, fName);
			hash_combine(seed, fValue);
			return seed;
		}